

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism.cc
# Opt level: O0

HomomorphismResult *
gss::solve_homomorphism_problem(InputGraph *pattern,InputGraph *target,HomomorphismParams *params)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  pointer pRVar7;
  undefined8 uVar8;
  HomomorphismParams *in_RCX;
  Proof *in_RSI;
  HomomorphismResult *in_RDI;
  bool in_stack_0000009f;
  vector<int,_std::allocator<int>_> *in_stack_000000a0;
  vector<int,_std::allocator<int>_> *in_stack_000000a8;
  int in_stack_000000b4;
  int in_stack_000000b8;
  int in_stack_000000bc;
  Proof *in_stack_000000c0;
  ThreadedSolver solver_1;
  uint n_threads;
  SequentialSolver solver;
  HomomorphismModel model;
  int *m;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  int v;
  CliqueResult clique_result;
  CliqueParams clique_params;
  int n_1;
  int t_1;
  int loop;
  int u_1;
  vector<int,_std::allocator<int>_> permitted_1;
  int q_1;
  int u;
  vector<int,_std::allocator<int>_> cancel_out;
  vector<int,_std::allocator<int>_> permitted;
  int q;
  int t;
  int p;
  int n;
  shared_ptr<gss::innards::Proof> proof;
  HomomorphismResult *result;
  HomomorphismModel *in_stack_00000ca8;
  CliqueParams *in_stack_00000d40;
  InputGraph *in_stack_00000d48;
  SequentialSolver *in_stack_00001148;
  int in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  undefined4 in_stack_fffffffffffff8a0;
  uint in_stack_fffffffffffff8a4;
  int in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  HomomorphismParams *in_stack_fffffffffffff8b0;
  HomomorphismModel *in_stack_fffffffffffff8b8;
  undefined6 in_stack_fffffffffffff8c0;
  ProofOptions *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  Proof *in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  Proof *in_stack_fffffffffffffb60;
  _Self local_3b0;
  _Self local_3a8;
  undefined1 *local_3a0;
  int local_398;
  undefined1 local_391;
  undefined1 local_390 [48];
  unsigned_long_long local_360;
  ThreadedSolver *in_stack_fffffffffffffcc8;
  byte local_330;
  int local_230;
  int local_22c;
  int local_1fc;
  int local_1e0;
  int local_1dc;
  int local_1a4;
  int local_1a0;
  int local_19c;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_stack_fffffffffffffe78;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  Proof *this;
  int local_144;
  __shared_ptr local_30 [16];
  HomomorphismParams *local_20;
  Proof *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::shared_ptr<gss::innards::Proof>::shared_ptr((shared_ptr<gss::innards::Proof> *)0x124e87);
  bVar1 = std::optional::operator_cast_to_bool((optional<gss::ProofOptions> *)0x124e9b);
  if (bVar1) {
    if (local_20->n_threads != 1) {
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8e0,
                 (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      UnsupportedConfiguration::UnsupportedConfiguration
                ((UnsupportedConfiguration *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      __cxa_throw(uVar8,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((local_20->clique_detection & 1U) != 0) {
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8e0,
                 (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      UnsupportedConfiguration::UnsupportedConfiguration
                ((UnsupportedConfiguration *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      __cxa_throw(uVar8,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>
                        *)0x1250b8);
    if (bVar1) {
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8e0,
                 (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      UnsupportedConfiguration::UnsupportedConfiguration
                ((UnsupportedConfiguration *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      __cxa_throw(uVar8,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    bVar1 = std::__cxx11::
            list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&local_20->pattern_less_constraints);
    if ((!bVar1) ||
       (bVar1 = std::__cxx11::
                list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(&local_20->target_occur_less_constraints), !bVar1)) {
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8e0,
                 (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      UnsupportedConfiguration::UnsupportedConfiguration
                ((UnsupportedConfiguration *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      __cxa_throw(uVar8,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((local_20->injectivity != Injective) && (local_20->injectivity != NonInjective)) {
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8e0,
                 (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      UnsupportedConfiguration::UnsupportedConfiguration
                ((UnsupportedConfiguration *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      __cxa_throw(uVar8,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    bVar1 = InputGraph::has_vertex_labels((InputGraph *)0x1253ec);
    if ((bVar1) || (bVar1 = InputGraph::has_edge_labels((InputGraph *)0x12540f), bVar1)) {
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8e0,
                 (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      UnsupportedConfiguration::UnsupportedConfiguration
                ((UnsupportedConfiguration *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      __cxa_throw(uVar8,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    std::optional<gss::ProofOptions>::operator*((optional<gss::ProofOptions> *)0x125541);
    std::make_shared<gss::innards::Proof,gss::ProofOptions_const&>(in_stack_fffffffffffff8c8);
    std::shared_ptr<gss::innards::Proof>::operator=
              ((shared_ptr<gss::innards::Proof> *)
               CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
               (shared_ptr<gss::innards::Proof> *)
               CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    std::shared_ptr<gss::innards::Proof>::~shared_ptr((shared_ptr<gss::innards::Proof> *)0x125575);
    for (local_144 = 0; iVar4 = InputGraph::size((InputGraph *)0x12559b), local_144 < iVar4;
        local_144 = local_144 + 1) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1255c7);
      InputGraph::size((InputGraph *)0x1255ea);
      this = local_10;
      std::function<std::__cxx11::string(int)>::
      function<gss::solve_homomorphism_problem(InputGraph_const&,InputGraph_const&,gss::HomomorphismParams_const&)::__0,void>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)in_stack_fffffffffffff8b0,
                 (anon_class_8_1_54331e70 *)
                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      std::function<std::__cxx11::string(int)>::
      function<gss::solve_homomorphism_problem(InputGraph_const&,InputGraph_const&,gss::HomomorphismParams_const&)::__1,void>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)in_stack_fffffffffffff8b0,
                 (anon_class_8_1_6ca262cf *)
                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      innards::Proof::create_cp_variable
                (this,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                   *)0x125687);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                   *)0x125694);
    }
    if (local_20->injectivity == Injective) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1256f8);
      InputGraph::size((InputGraph *)0x12570d);
      InputGraph::size((InputGraph *)0x125723);
      innards::Proof::create_injectivity_constraints
                (in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58);
    }
    for (local_19c = 0; iVar4 = InputGraph::size((InputGraph *)0x125771), local_19c < iVar4;
        local_19c = local_19c + 1) {
      for (local_1a0 = 0; iVar4 = InputGraph::size((InputGraph *)0x1257b6), local_1a0 < iVar4;
          local_1a0 = local_1a0 + 1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1257e2);
        innards::Proof::start_adjacency_constraints_for
                  ((Proof *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   in_stack_fffffffffffff89c,in_stack_fffffffffffff898);
        for (local_1a4 = 0; iVar4 = InputGraph::size((InputGraph *)0x125820), local_1a4 < iVar4;
            local_1a4 = local_1a4 + 1) {
          bVar1 = InputGraph::adjacent
                            ((InputGraph *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
                             in_stack_fffffffffffff8a8);
          if (bVar1) {
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x125880);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)0x12588d);
            for (local_1dc = 0; iVar4 = InputGraph::size((InputGraph *)0x1258b3), local_1dc < iVar4;
                local_1dc = local_1dc + 1) {
              bVar1 = InputGraph::adjacent
                                ((InputGraph *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
                                 in_stack_fffffffffffff8a8);
              if ((bVar1) &&
                 (std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b0,
                             (value_type_conflict1 *)
                             CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8)),
                 local_1a0 == local_1dc)) {
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b0,
                           (value_type_conflict1 *)
                           CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
              }
            }
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x12599d);
            in_stack_fffffffffffff898 = 0;
            innards::Proof::create_adjacency_constraint
                      (in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b4,
                       in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b0);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b0);
          }
        }
        if ((local_20->induced & 1U) != 0) {
          for (local_1e0 = 0; iVar4 = InputGraph::size((InputGraph *)0x125a3f), local_1e0 < iVar4;
              local_1e0 = local_1e0 + 1) {
            if ((local_1e0 != local_19c) &&
               (bVar1 = InputGraph::adjacent
                                  ((InputGraph *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac
                                   ,in_stack_fffffffffffff8a8), !bVar1)) {
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)0x125ab4);
              for (local_1fc = 0; iVar4 = InputGraph::size((InputGraph *)0x125ada),
                  local_1fc < iVar4; local_1fc = local_1fc + 1) {
                if ((local_1a0 != local_1fc) &&
                   (in_stack_fffffffffffff957 =
                         InputGraph::adjacent
                                   ((InputGraph *)in_stack_fffffffffffff8b0,
                                    in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                   !(bool)in_stack_fffffffffffff957)) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b0,
                             (value_type_conflict1 *)
                             CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
                }
              }
              std::
              __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x125b91);
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)0x125bf1);
              in_stack_fffffffffffff898 = 1;
              innards::Proof::create_adjacency_constraint
                        (in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b4,
                         in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b0);
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b0);
            }
          }
        }
      }
    }
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x125cd4);
    innards::Proof::finalise_model(in_stack_fffffffffffffab0);
  }
  bVar1 = innards::is_nonshrinking(local_20);
  if (bVar1) {
    iVar4 = InputGraph::size((InputGraph *)0x125d13);
    iVar5 = InputGraph::size((InputGraph *)0x125d29);
    if (iVar5 < iVar4) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
      if (bVar1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x125d68);
        innards::Proof::failure_due_to_pattern_bigger_than_target
                  ((Proof *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x125d7f);
        innards::Proof::finish_unsat_proof
                  ((Proof *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
      memset(in_RDI,0,0x30);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x125dac);
      in_RDI->nodes = 0;
      in_RDI->propagations = 0;
      memset(&in_RDI->extra_stats,0,0x18);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x125de9);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::number<int>((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                     *)in_stack_fffffffffffff8b0,
                    (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                    (type *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      in_RDI->complete = false;
      goto LAB_00126881;
    }
  }
  if (((((local_20->injectivity != NonInjective) ||
        (bVar1 = InputGraph::has_vertex_labels((InputGraph *)0x125e4f), bVar1)) ||
       (bVar1 = InputGraph::has_edge_labels((InputGraph *)0x125e70), bVar1)) ||
      ((bVar1 = InputGraph::loopy((InputGraph *)0x125e91), !bVar1 ||
       ((local_20->count_solutions & 1U) != 0)))) ||
     (bVar1 = std::function::operator_cast_to_bool
                        ((function<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&)>
                          *)0x125ec7), bVar1)) {
    bVar1 = innards::can_use_clique
                      ((HomomorphismParams *)
                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    if ((bVar1) &&
       (bVar1 = innards::is_simple_clique
                          ((InputGraph *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898)), bVar1)) {
      CliqueParams::CliqueParams((CliqueParams *)in_stack_fffffffffffff8b0);
      std::shared_ptr<gss::Timeout>::operator=
                ((shared_ptr<gss::Timeout> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (shared_ptr<gss::Timeout> *)
                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      InputGraph::size((InputGraph *)0x126110);
      std::make_optional<int>((int *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      std::optional<unsigned_int>::operator=
                ((optional<unsigned_int> *)in_stack_fffffffffffff8b0,
                 (optional<int> *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      std::make_unique<gss::NoRestartsSchedule>();
      std::unique_ptr<gss::RestartsSchedule,std::default_delete<gss::RestartsSchedule>>::operator=
                ((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
                 in_stack_fffffffffffff8b0,
                 (unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                  *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
      ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                   *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      solve_clique_problem(in_stack_00000d48,in_stack_00000d40);
      local_391 = 0;
      HomomorphismResult::HomomorphismResult
                ((HomomorphismResult *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                );
      local_398 = 0;
      local_3a0 = local_390;
      local_3a8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_3b0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      while (bVar1 = std::operator==(&local_3a8,&local_3b0), ((bVar1 ^ 0xffU) & 1) != 0) {
        std::_Rb_tree_const_iterator<int>::operator*
                  ((_Rb_tree_const_iterator<int> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
        local_398 = local_398 + 1;
        std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
        emplace<int,int_const&>
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   in_stack_fffffffffffff8b0,
                   (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                   (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
        iVar4 = local_398;
        iVar5 = InputGraph::size((InputGraph *)0x12629d);
        if (iVar5 <= iVar4) break;
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
      in_RDI->nodes = local_360;
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff8b0,
                  (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[26]>
                ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff8b0,
                 (char (*) [26])CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
      in_RDI->complete = (bool)(local_330 & 1);
      local_391 = 1;
      CliqueResult::~CliqueResult
                ((CliqueResult *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      CliqueParams::~CliqueParams
                ((CliqueParams *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    }
    else {
      innards::HomomorphismModel::HomomorphismModel
                ((HomomorphismModel *)
                 model.target_occur_less_thans_in_convenient_order.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (InputGraph *)
                 model.pattern_less_thans_in_convenient_order.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (InputGraph *)
                 model.pattern_less_thans_in_convenient_order.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (HomomorphismParams *)
                 model.pattern_less_thans_in_convenient_order.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (shared_ptr<gss::innards::Proof> *)model._16_8_);
      uVar2 = innards::HomomorphismModel::prepare(in_stack_00000ca8);
      if ((bool)uVar2) {
        HomomorphismResult::HomomorphismResult
                  ((HomomorphismResult *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
        if (local_20->n_threads == 1) {
          anon_unknown.dwarf_486d5::SequentialSolver::HomomorphismSolver
                    ((SequentialSolver *)in_stack_fffffffffffff8b0,
                     (HomomorphismModel *)
                     CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                     (HomomorphismParams *)
                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     (shared_ptr<gss::innards::Proof> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          anon_unknown.dwarf_486d5::SequentialSolver::solve(in_stack_00001148);
          HomomorphismResult::operator=
                    ((HomomorphismResult *)
                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     (HomomorphismResult *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          HomomorphismResult::~HomomorphismResult
                    ((HomomorphismResult *)
                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
          anon_unknown.dwarf_486d5::SequentialSolver::~SequentialSolver
                    ((SequentialSolver *)0x126581);
        }
        else {
          pRVar7 = std::
                   unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
                   operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                               *)0x1265d6);
          uVar6 = (*pRVar7->_vptr_RestartsSchedule[5])();
          uVar3 = (undefined1)uVar6;
          if ((uVar6 & 1) == 0) {
            uVar8 = __cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff8e0,
                       (char *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            UnsupportedConfiguration::UnsupportedConfiguration
                      ((UnsupportedConfiguration *)
                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
            __cxa_throw(uVar8,&UnsupportedConfiguration::typeinfo,
                        UnsupportedConfiguration::~UnsupportedConfiguration);
          }
          uVar6 = innards::how_many_threads(0);
          anon_unknown.dwarf_486d5::ThreadedSolver::ThreadedSolver
                    ((ThreadedSolver *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff8c0)),
                     in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                     (shared_ptr<gss::innards::Proof> *)CONCAT44(uVar6,in_stack_fffffffffffff8a8),
                     in_stack_fffffffffffff8a4);
          anon_unknown.dwarf_486d5::ThreadedSolver::solve(in_stack_fffffffffffffcc8);
          HomomorphismResult::operator=
                    ((HomomorphismResult *)
                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     (HomomorphismResult *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          HomomorphismResult::~HomomorphismResult
                    ((HomomorphismResult *)
                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
          anon_unknown.dwarf_486d5::ThreadedSolver::~ThreadedSolver((ThreadedSolver *)0x126766);
        }
        bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
        if (bVar1) {
          if (((in_RDI->complete & 1U) == 0) ||
             (bVar1 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      empty((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)0x1267c2), !bVar1)) {
            bVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::empty((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)0x1267ee);
            if (bVar1) {
              std::
              __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x126818);
              innards::Proof::finish_unknown_proof((Proof *)0x126820);
            }
            else {
              std::
              __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1267ff);
              innards::Proof::finish_sat_proof((Proof *)0x126807);
            }
          }
          else {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1267d5);
            innards::Proof::finish_unsat_proof
                      ((Proof *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
          }
        }
      }
      else {
        HomomorphismResult::HomomorphismResult
                  ((HomomorphismResult *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
        std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[25]>
                  ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff8b0,
                   (char (*) [25])CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        in_RDI->complete = true;
        bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
        if (bVar1) {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x12646f);
          innards::Proof::finish_unsat_proof
                    ((Proof *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
        }
      }
      innards::HomomorphismModel::~HomomorphismModel
                ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0))
      ;
    }
  }
  else {
    HomomorphismResult::HomomorphismResult
              ((HomomorphismResult *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[27]>
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff8b0,
               (char (*) [27])CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
    in_RDI->complete = true;
    local_22c = 0;
    while ((iVar4 = InputGraph::size((InputGraph *)0x125f3b), local_22c < iVar4 &&
           (bVar1 = InputGraph::adjacent
                              ((InputGraph *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
                               in_stack_fffffffffffff8a8), !bVar1))) {
      local_22c = local_22c + 1;
    }
    for (local_230 = 0; iVar4 = InputGraph::size((InputGraph *)0x125fe4), local_230 < iVar4;
        local_230 = local_230 + 1) {
      std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::emplace<int&,int&>
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 in_stack_fffffffffffff8b0,
                 (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                 (int *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::operator++((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  }
LAB_00126881:
  std::shared_ptr<gss::innards::Proof>::~shared_ptr((shared_ptr<gss::innards::Proof> *)0x12688e);
  return in_RDI;
}

Assistant:

auto gss::solve_homomorphism_problem(
    const InputGraph & pattern,
    const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    // start by setting up proof logging, if necessary
    shared_ptr<Proof> proof;
    if (params.proof_options) {
        // proof logging is currently incompatible with a whole load of "extra" features,
        // but can be adapted to support most of them
        if (1 != params.n_threads)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with threads"};
        if (params.clique_detection)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with clique detection, use --no-clique-detection"};
        if (params.lackey)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with a lackey"};
        if (! params.pattern_less_constraints.empty() || ! params.target_occur_less_constraints.empty())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with less-constraints"};
        if (params.injectivity != Injectivity::Injective && params.injectivity != Injectivity::NonInjective)
            throw UnsupportedConfiguration{"Proof logging can currently only be used with injectivity or non-injectivity"};
        if (pattern.has_vertex_labels() || pattern.has_edge_labels())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used on labelled graphs"};

        proof = make_shared<Proof>(*params.proof_options);

        // set up our model file, with a set of OPB variables for each CP variable
        for (int n = 0; n < pattern.size(); ++n) {
            proof->create_cp_variable(
                n, target.size(),
                [&](int v) { return pattern.vertex_name(v); },
                [&](int v) { return target.vertex_name(v); });
        }

        // generate constraints for injectivity
        if (params.injectivity == Injectivity::Injective)
            proof->create_injectivity_constraints(pattern.size(), target.size());

        // generate edge constraints, and also handle loops here
        for (int p = 0; p < pattern.size(); ++p) {
            for (int t = 0; t < target.size(); ++t) {
                // it's simpler to always have the adjacency constraints, even
                // if the assignment is forbidden
                proof->start_adjacency_constraints_for(p, t);

                // if p can be mapped to t, then each neighbour of p...
                for (int q = 0; q < pattern.size(); ++q)
                    if (pattern.adjacent(p, q)) {
                        // ... must be mapped to a neighbour of t
                        vector<int> permitted, cancel_out;
                        for (int u = 0; u < target.size(); ++u)
                            if (target.adjacent(t, u)) {
                                permitted.push_back(u);
                                if (t == u)
                                    cancel_out.push_back(t);
                            }
                        proof->create_adjacency_constraint(p, q, t, permitted, cancel_out, false);
                    }

                // same for non-adjacency for induced
                if (params.induced) {
                    for (int q = 0; q < pattern.size(); ++q)
                        if (q != p && ! pattern.adjacent(p, q)) {
                            // ... must be mapped to a neighbour of t
                            vector<int> permitted;
                            for (int u = 0; u < target.size(); ++u)
                                if (t != u && ! target.adjacent(t, u))
                                    permitted.push_back(u);
                            proof->create_adjacency_constraint(p, q, t, permitted, vector<int>{}, true);
                        }
                }
            }
        }

        // output the model file
        proof->finalise_model();
    }

    // first sanity check: if we're finding an injective mapping, and there
    // aren't enough vertices, fail immediately.
    if (is_nonshrinking(params) && (pattern.size() > target.size())) {
        if (proof) {
            proof->failure_due_to_pattern_bigger_than_target();
            proof->finish_unsat_proof();
        }

        return HomomorphismResult{};
    }

    // does the target have loops, and are we looking for a single non-injective mapping?
    if ((params.injectivity == Injectivity::NonInjective) && ! pattern.has_vertex_labels() && ! pattern.has_edge_labels() && target.loopy() && ! params.count_solutions && ! params.enumerate_callback) {
        HomomorphismResult result;
        result.extra_stats.emplace_back("used_loops_property = true");
        result.complete = true;
        int loop = -1;
        for (int t = 0; t < target.size(); ++t)
            if (target.adjacent(t, t)) {
                loop = t;
                break;
            }

        for (int n = 0; n < pattern.size(); ++n)
            result.mapping.emplace(n, loop);

        ++result.solution_count;

        return result;
    }

    // is the pattern a clique? if so, use a clique algorithm instead
    if (can_use_clique(params) && is_simple_clique(pattern)) {
        CliqueParams clique_params;
        clique_params.timeout = params.timeout;
        clique_params.start_time = params.start_time;
        clique_params.decide = make_optional(pattern.size());
        clique_params.restarts_schedule = make_unique<NoRestartsSchedule>();
        auto clique_result = solve_clique_problem(target, clique_params);

        // now translate the result back into what we expect
        HomomorphismResult result;
        int v = 0;
        for (auto & m : clique_result.clique) {
            result.mapping.emplace(v++, m);
            // the clique solver can find a bigger clique than we ask for
            if (v >= pattern.size())
                break;
        }
        result.nodes = clique_result.nodes;
        result.extra_stats = move(clique_result.extra_stats);
        result.extra_stats.emplace_back("used_clique_solver = true");
        result.complete = clique_result.complete;

        return result;
    }
    else {
        // just solve the problem
        HomomorphismModel model(target, pattern, params, proof);

        if (! model.prepare()) {
            HomomorphismResult result;
            result.extra_stats.emplace_back("model_consistent = false");
            result.complete = true;
            if (proof)
                proof->finish_unsat_proof();
            return result;
        }

        HomomorphismResult result;
        if (1 == params.n_threads) {
            SequentialSolver solver(model, params, proof);
            result = solver.solve();
        }
        else {
            if (! params.restarts_schedule->might_restart())
                throw UnsupportedConfiguration{"Threaded search requires restarts"};

            unsigned n_threads = how_many_threads(params.n_threads);
            ThreadedSolver solver(model, params, proof, n_threads);
            result = solver.solve();
        }

        if (proof) {
            if (result.complete && result.mapping.empty())
                proof->finish_unsat_proof();
            else if (! result.mapping.empty())
                proof->finish_sat_proof();
            else
                proof->finish_unknown_proof();
        }

        return result;
    }
}